

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToTypes_Test::testBody
          (TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToTypes_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *this_00;
  UtestShell *test;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_190;
  SimpleString local_180;
  SimpleString local_170;
  SimpleString local_160;
  SimpleString local_150;
  SimpleString local_140;
  SimpleString local_130;
  undefined1 local_120 [8];
  MockUnexpectedInputParameterFailure expectedFailure;
  undefined1 local_a8 [8];
  MockNamedValue parameter;
  SimpleString local_48 [2];
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToTypes_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  SimpleString::SimpleString(local_48,"foo");
  this_00 = MockExpectedCallsListForTest::addFunction
                      ((MockExpectedCallsListForTest *)local_28,local_48);
  SimpleString::SimpleString((SimpleString *)&parameter.copier_,"parameter");
  MockExpectedCall::withParameter
            (&this_00->super_MockExpectedCall,(SimpleString *)&parameter.copier_,10);
  SimpleString::~SimpleString((SimpleString *)&parameter.copier_);
  SimpleString::~SimpleString(local_48);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"parameter");
  MockNamedValue::MockNamedValue
            ((MockNamedValue *)local_a8,
             (SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  MockNamedValue::setValue((MockNamedValue *)local_a8,"heh");
  test = mockFailureTest();
  SimpleString::SimpleString(&local_130,"foo");
  MockUnexpectedInputParameterFailure::MockUnexpectedInputParameterFailure
            ((MockUnexpectedInputParameterFailure *)local_120,test,&local_130,
             (MockNamedValue *)local_a8,(MockExpectedCallsList *)local_28);
  SimpleString::~SimpleString(&local_130);
  SimpleString::SimpleString(&local_140,"");
  pMVar2 = mock(&local_140,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_150,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_150);
  SimpleString::SimpleString(&local_160,"parameter");
  MockExpectedCall::withParameter((MockExpectedCall *)CONCAT44(extraout_var,iVar1),&local_160,10);
  SimpleString::~SimpleString(&local_160);
  SimpleString::~SimpleString(&local_150);
  SimpleString::~SimpleString(&local_140);
  SimpleString::SimpleString(&local_170,"");
  pMVar2 = mock(&local_170,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_180,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_180);
  SimpleString::SimpleString(&local_190,"parameter");
  MockActualCall::withParameter((MockActualCall *)CONCAT44(extraout_var_00,iVar1),&local_190,"heh");
  SimpleString::~SimpleString(&local_190);
  SimpleString::~SimpleString(&local_180);
  SimpleString::~SimpleString(&local_170);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_120,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x1f2);
  MockUnexpectedInputParameterFailure::~MockUnexpectedInputParameterFailure
            ((MockUnexpectedInputParameterFailure *)local_120);
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_a8);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockParameterTest, expectOneIntegerParameterAndFailsDueToTypes)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", 10);
    MockNamedValue parameter("parameter");
    parameter.setValue("heh");
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withParameter("parameter", 10);
    mock().actualCall("foo").withParameter("parameter", "heh");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}